

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::ChompCharInst<(UnifiedRegex::ChompMode)1>::Exec
          (ChompCharInst<(UnifiedRegex::ChompMode)1> *this,Matcher *matcher,Char *input,
          CharCount inputLength,CharCount *matchStart,CharCount *inputOffset,
          CharCount *nextSyncInputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  Char CVar1;
  Char matchC;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  ChompCharInst<(UnifiedRegex::ChompMode)1> *this_local;
  
  CVar1 = (this->super_CharMixin).c;
  Matcher::CompStats(matcher);
  if ((*inputOffset < inputLength) && (input[*inputOffset] == CVar1)) {
    do {
      *inputOffset = *inputOffset + 1;
      Matcher::CompStats(matcher);
      if (inputLength <= *inputOffset) break;
    } while (input[*inputOffset] == CVar1);
    *instPointer = *instPointer + 3;
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ =
         Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
  }
  return this_local._7_1_;
}

Assistant:

inline bool ChompCharInst<Mode>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        const Char matchC = c;
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (Mode == ChompMode::Star || (inputOffset < inputLength && input[inputOffset] == matchC))
        {
            while (true)
            {
                if (Mode != ChompMode::Star)
                {
                    ++inputOffset;
                }
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.CompStats();
#endif
                if (inputOffset < inputLength && input[inputOffset] == matchC)
                {
                    if (Mode == ChompMode::Star)
                    {
                        ++inputOffset;
                    }
                    continue;
                }
                break;
            }

            instPointer += sizeof(*this);
            return false;
        }

        return matcher.Fail(FAIL_PARAMETERS);
    }